

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O3

msocket_t * msocket_accept(msocket_t *self,msocket_t *child)

{
  pthread_mutex_t *__mutex;
  uint8_t uVar1;
  int iVar2;
  msocket_t *self_00;
  char *pcVar3;
  int iVar4;
  socklen_t cli_len;
  sockaddr_in cli_addr;
  socklen_t local_5c;
  sockaddr local_58;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  if (self == (msocket_t *)0x0) {
    return (msocket_t *)0x0;
  }
  if (self->state != '\x01') {
    return (msocket_t *)0x0;
  }
  if (child == (msocket_t *)0x0) {
    self_00 = msocket_new(self->addressFamily);
  }
  else {
    msocket_create(child,self->addressFamily);
    self_00 = child;
  }
  __mutex = &self->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  self->state = '\x02';
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  uVar1 = self->addressFamily;
  iVar4 = -1;
  if (uVar1 == '\x01') {
    iVar2 = accept(self->tcpsockfd,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar2 < 0) goto LAB_0013e541;
    self_00->tcpsockfd = iVar2;
  }
  else {
    if (uVar1 == '\n') {
      local_5c = 0x1c;
      local_58.sa_family = 0;
      local_58.sa_data[0] = '\0';
      local_58.sa_data[1] = '\0';
      local_58.sa_data[2] = '\0';
      local_58.sa_data[3] = '\0';
      local_58.sa_data[4] = '\0';
      local_58.sa_data[5] = '\0';
      local_58.sa_data[6] = '\0';
      local_58.sa_data[7] = '\0';
      local_58.sa_data[8] = '\0';
      local_58.sa_data[9] = '\0';
      local_58.sa_data[10] = '\0';
      local_58.sa_data[0xb] = '\0';
      local_58.sa_data[0xc] = '\0';
      local_58.sa_data[0xd] = '\0';
      uStack_48 = 0;
      uStack_44 = 0;
      iVar2 = accept(self->tcpsockfd,&local_58,&local_5c);
      iVar4 = -1;
      if (iVar2 < 0) goto LAB_0013e541;
      pcVar3 = local_58.sa_data + 6;
    }
    else {
      if (uVar1 != '\x02') goto LAB_0013e541;
      local_5c = 0x10;
      local_58.sa_family = 0;
      local_58.sa_data[0] = '\0';
      local_58.sa_data[1] = '\0';
      local_58.sa_data[2] = '\0';
      local_58.sa_data[3] = '\0';
      local_58.sa_data[4] = '\0';
      local_58.sa_data[5] = '\0';
      local_58.sa_data[6] = '\0';
      local_58.sa_data[7] = '\0';
      local_58.sa_data[8] = '\0';
      local_58.sa_data[9] = '\0';
      local_58.sa_data[10] = '\0';
      local_58.sa_data[0xb] = '\0';
      local_58.sa_data[0xc] = '\0';
      local_58.sa_data[0xd] = '\0';
      iVar2 = accept(self->tcpsockfd,&local_58,&local_5c);
      iVar4 = -1;
      if (iVar2 < 0) goto LAB_0013e541;
      pcVar3 = local_58.sa_data + 2;
    }
    iVar4 = -1;
    pcVar3 = inet_ntop(2,pcVar3,(self_00->tcpInfo).addr,0x2e);
    if (pcVar3 == (char *)0x0) {
      close(iVar2);
      goto LAB_0013e541;
    }
    (self_00->tcpInfo).port = local_58.sa_data._0_2_ << 8 | (ushort)local_58.sa_data._0_2_ >> 8;
    self_00->tcpsockfd = iVar2;
  }
  iVar4 = 0;
LAB_0013e541:
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  self->state = '\x01';
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (iVar4 < 0) {
    if (child == (msocket_t *)0x0) {
      if (self_00 != (msocket_t *)0x0) {
        msocket_destroy(self_00);
        free(self_00);
      }
    }
    else {
      msocket_destroy(self_00);
    }
    return (msocket_t *)0x0;
  }
  if ((self_00->addressFamily | 8) == 10) {
    local_58._0_4_ = 1;
    setsockopt(self_00->tcpsockfd,6,1,&local_58,4);
  }
  pthread_mutex_lock((pthread_mutex_t *)&self_00->mutex);
  self_00->state = '\x04';
  self_00->socketMode = '\x02';
  self_00->newConnection = '\x01';
  pthread_mutex_unlock((pthread_mutex_t *)&self_00->mutex);
  return self_00;
}

Assistant:

msocket_t *msocket_accept(msocket_t *self, msocket_t *child){
   if ( (self != 0) && (self->state == MSOCKET_STATE_LISTENING) ) {

      uint8_t placementNew = 0u;
      int result = 0u;

      if(child == 0) {
         child = msocket_new(self->addressFamily);
      }
      else {
         placementNew = 1;
         msocket_create(child,self->addressFamily);
      }
      MUTEX_LOCK(self->mutex);
      self->state = MSOCKET_STATE_ACCEPTING;
      MUTEX_UNLOCK(self->mutex);

      switch (self->addressFamily) {
      case AF_INET:
         result = msocket_accept_inet(self, child);
         break;
      case AF_INET6:
         result = msocket_accept_inet6(self, child);
         break;
#ifndef _WIN32
      case AF_LOCAL:
         result = msocket_accept_local(self, child);
         break;
      default:
         result = -1;
#endif
      }

      MUTEX_LOCK(self->mutex);
      self->state = MSOCKET_STATE_LISTENING;
      MUTEX_UNLOCK(self->mutex);

      if (result < 0) {
         if (placementNew == 0) {
            msocket_delete(child);
         }
         else {
            msocket_destroy(child);
         }
         return (msocket_t*)0;
      }

      if ( (child->addressFamily == AF_INET) || (child->addressFamily == AF_INET6) ) {
         int sockoptval = 1;
         socklen_t sockoptlen = sizeof(sockoptval);
         setsockopt(child->tcpsockfd, IPPROTO_TCP, TCP_NODELAY, (const char*)&sockoptval, sockoptlen);
      }

      MUTEX_LOCK(child->mutex);
      child->state = MSOCKET_STATE_ESTABLISHED;
      child->socketMode = MSOCKET_MODE_TCP;
      child->newConnection = 1;
      MUTEX_UNLOCK(child->mutex);
      return child;
   }
   return (msocket_t *) 0;
}